

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

_Bool art_node_iterator_lower_bound(art_node_t *node,art_iterator_t *iterator,art_key_chunk_t *key)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  size_t i;
  uint8_t *puVar6;
  ulong uVar7;
  art_val_t *paVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  byte unaff_BPL;
  uint uVar12;
  art_inner_node_t *node_00;
  
  do {
    if (((ulong)node & 1) != 0) {
      paVar8 = (art_val_t *)((ulong)node & 0xfffffffffffffffe);
      uVar9 = *(uint *)paVar8->key;
      uVar10 = *(uint *)key;
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      if (uVar9 == uVar10) {
        uVar9 = (uint)(ushort)(*(ushort *)(paVar8->key + 4) << 8 | *(ushort *)(paVar8->key + 4) >> 8
                              );
        uVar10 = (uint)(ushort)(*(ushort *)(key + 4) << 8 | *(ushort *)(key + 4) >> 8);
        uVar12 = 0;
        if (uVar9 != uVar10) goto LAB_00113670;
      }
      else {
LAB_00113670:
        uVar12 = -(uint)(uVar9 < uVar10) | 1;
      }
      if ((int)uVar12 < 0) {
        _Var4 = art_iterator_up_and_move(iterator,true);
        return _Var4;
      }
      bVar1 = iterator->frame;
      iterator->frames[bVar1].node = node;
      iterator->frames[bVar1].index_in_node = '\0';
      *(undefined2 *)(iterator->key + 4) = *(undefined2 *)(paVar8->key + 4);
      *(undefined4 *)iterator->key = *(undefined4 *)paVar8->key;
      iterator->value = paVar8;
      unaff_BPL = 1;
      break;
    }
    bVar1 = iterator->depth;
    bVar2 = ((art_inner_node_t *)node)->prefix_size;
    iVar5 = memcmp(((art_inner_node_t *)node)->prefix,key + bVar1,(ulong)bVar2);
    if (iVar5 < 0) {
LAB_001134ca:
      unaff_BPL = art_iterator_up_and_move(iterator,true);
LAB_001134f0:
      bVar3 = false;
      node_00 = (art_inner_node_t *)node;
    }
    else {
      if (iVar5 != 0) {
        art_node_init_iterator(node,iterator,true);
        unaff_BPL = true;
        goto LAB_001134f0;
      }
      bVar1 = (key + bVar1)[bVar2];
      uVar7 = (ulong)bVar1;
      switch(((art_inner_node_t *)node)->typecode) {
      case '\0':
        if ((ulong)((art_inner_node_t *)((long)node + 7))->typecode != 0) {
          uVar7 = 0;
          do {
            bVar2 = ((art_inner_node_t *)((long)node + 7))->prefix[uVar7 - 1];
            if (bVar1 <= bVar2) {
              node_00 = *(art_inner_node_t **)((long)node + uVar7 * 8 + 0x10);
LAB_001135d8:
              uVar11 = (ulong)bVar2;
              goto LAB_001135db;
            }
            uVar7 = uVar7 + 1;
          } while (((art_inner_node_t *)((long)node + 7))->typecode != uVar7);
        }
        break;
      case '\x01':
        if ((ulong)((art_inner_node_t *)((long)node + 7))->typecode != 0) {
          uVar7 = 0;
          do {
            bVar2 = ((art_inner_node_t *)((long)node + 7))->prefix[uVar7 - 1];
            if (bVar1 <= bVar2) {
              node_00 = *(art_inner_node_t **)((long)node + uVar7 * 8 + 0x18);
              goto LAB_001135d8;
            }
            uVar7 = uVar7 + 1;
          } while (((art_inner_node_t *)((long)node + 7))->typecode != uVar7);
        }
        break;
      case '\x02':
        uVar11 = (ulong)CONCAT11(bVar1,bVar1);
        puVar6 = ((art_inner_node_t *)((long)node + 0xe))->prefix + uVar7;
        do {
          if ((ulong)*puVar6 != 0x30) {
            node_00 = *(art_inner_node_t **)((long)node + (ulong)*puVar6 * 8 + 0x110);
            goto LAB_001135de;
          }
          uVar11 = uVar11 + 0x101;
          puVar6 = puVar6 + 1;
        } while (uVar11 != 0x10100);
        break;
      case '\x03':
        do {
          node_00 = *(art_inner_node_t **)((long)node + uVar7 * 8 + 0x10);
          uVar11 = uVar7;
          if (node_00 != (art_inner_node_t *)0x0) goto LAB_001135db;
          uVar7 = uVar7 + 1;
        } while (uVar7 != 0x100);
        node_00 = (art_inner_node_t *)0x0;
        uVar7 = 0;
        uVar11 = uVar7;
LAB_001135db:
        uVar11 = uVar11 * 0x100 + uVar7;
        goto LAB_001135de;
      }
      node_00 = (art_inner_node_t *)0x0;
      uVar11 = 0;
LAB_001135de:
      if (node_00 == (art_inner_node_t *)0x0) goto LAB_001134ca;
      art_iterator_down(iterator,(art_inner_node_t *)node,(uint8_t)uVar11);
      bVar3 = true;
      if ((uint)bVar1 < ((uint)(uVar11 >> 8) & 0xff)) {
        art_node_init_iterator((art_node_t *)node_00,iterator,true);
        bVar3 = false;
        unaff_BPL = 1;
        node_00 = (art_inner_node_t *)node;
      }
    }
    node = (art_node_t *)node_00;
  } while (bVar3);
  return (_Bool)(unaff_BPL & 1);
}

Assistant:

static bool art_node_iterator_lower_bound(const art_node_t *node,
                                          art_iterator_t *iterator,
                                          const art_key_chunk_t key[]) {
    while (!art_is_leaf(node)) {
        art_inner_node_t *inner_node = (art_inner_node_t *)node;
        int prefix_comparison =
            art_compare_prefix(inner_node->prefix, 0, key, iterator->depth,
                               inner_node->prefix_size);
        if (prefix_comparison < 0) {
            // Prefix so far has been equal, but we've found a smaller key.
            // Since we take the lower bound within each node, we can return the
            // next leaf.
            return art_iterator_up_and_move(iterator, true);
        } else if (prefix_comparison > 0) {
            // No key equal to the key we're looking for, return the first leaf.
            return art_node_init_iterator(node, iterator, true);
        }
        // Prefix is equal, move to lower bound child.
        art_key_chunk_t key_chunk =
            key[iterator->depth + inner_node->prefix_size];
        art_indexed_child_t indexed_child =
            art_node_lower_bound(node, key_chunk);
        if (indexed_child.child == NULL) {
            // Only smaller keys among children.
            return art_iterator_up_and_move(iterator, true);
        }
        if (indexed_child.key_chunk > key_chunk) {
            // Only larger children, return the first larger child.
            art_iterator_down(iterator, inner_node, indexed_child.index);
            return art_node_init_iterator(indexed_child.child, iterator, true);
        }
        // We found a child with an equal prefix.
        art_iterator_down(iterator, inner_node, indexed_child.index);
        node = indexed_child.child;
    }
    art_leaf_t *leaf = CAST_LEAF(node);
    if (art_compare_keys(leaf->key, key) >= 0) {
        // Leaf has an equal or larger key.
        return art_iterator_valid_loc(iterator, leaf);
    }
    // Leaf has an equal prefix, but the full key is smaller. Move to the next
    // leaf.
    return art_iterator_up_and_move(iterator, true);
}